

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O1

int32 ps_lattice_posterior(ps_lattice_t *dag,ngram_model_t *lmset,float32 ascale)

{
  s3wid_t w;
  logmath_t *lmath;
  ps_search_t *ppVar1;
  int iVar2;
  int iVar3;
  int32 iVar4;
  ps_latlink_t *ppVar5;
  uint uVar6;
  latlink_list_t *plVar7;
  ps_latlink_s *ppVar8;
  ps_latlink_s *ppVar9;
  ngram_model_t *model;
  ps_latnode_t *ppVar10;
  bool bVar11;
  bool bVar12;
  int32 from_wid;
  int32 n_used;
  s3wid_t local_4c;
  ps_latlink_t *local_48;
  int local_40;
  int32 local_3c;
  ngram_model_t *local_38;
  
  lmath = dag->lmath;
  local_38 = lmset;
  for (ppVar10 = dag->nodes; ppVar10 != (ps_latnode_t *)0x0; ppVar10 = ppVar10->next) {
    for (plVar7 = ppVar10->exits; plVar7 != (latlink_list_t *)0x0; plVar7 = plVar7->next) {
      iVar2 = logmath_get_zero(lmath);
      plVar7->link->beta = iVar2;
    }
  }
  ppVar8 = (ps_latlink_t *)0x0;
  ppVar5 = ps_lattice_reverse_edges(dag,(ps_latnode_t *)0x0,(ps_latnode_t *)0x0);
  if (ppVar5 != (ps_latlink_t *)0x0) {
    local_40 = -0x80000000;
    ppVar8 = (ps_latlink_t *)0x0;
    do {
      local_4c = ppVar5->from->basewid;
      w = ppVar5->to->basewid;
      iVar2 = dict_filler_word(dag->dict,local_4c);
      if (iVar2 == 0) {
        bVar11 = false;
      }
      else {
        bVar11 = ppVar5->from != dag->start;
      }
      local_48 = ppVar8;
      iVar2 = dict_filler_word(dag->dict,w);
      if (iVar2 == 0) {
        bVar12 = false;
      }
      else {
        bVar12 = ppVar5->to != dag->end;
      }
      if ((!bVar12) && (ppVar8 = ppVar5, bVar11)) {
        do {
          ppVar8 = ppVar8->best_prev;
          if (ppVar8 == (ps_latlink_s *)0x0) {
            bVar11 = true;
            goto LAB_00110816;
          }
          local_4c = ppVar8->from->basewid;
          iVar2 = dict_filler_word(dag->dict,local_4c);
          if (iVar2 == 0) {
            bVar11 = false;
            goto LAB_00110816;
          }
        } while (ppVar8->from != dag->start);
        bVar11 = false;
      }
LAB_00110816:
      ppVar8 = local_48;
      iVar2 = 0;
      if ((local_38 != (ngram_model_t *)0x0) && (iVar2 = 0, !bVar11 && !bVar12)) {
        iVar2 = ngram_ng_prob(local_38,w,&local_4c,1,&local_3c);
      }
      if (ppVar5->to == dag->end) {
        if (local_40 < ppVar5->path_scr) {
          local_40 = ppVar5->path_scr;
          ppVar8 = ppVar5;
        }
        ppVar5->beta = iVar2 + (int)((float)(dag->final_node_ascr << 10) * (float)ascale);
      }
      else {
        for (plVar7 = ppVar5->to->exits; plVar7 != (latlink_list_t *)0x0; plVar7 = plVar7->next) {
          iVar3 = logmath_add(lmath,ppVar5->beta,
                              (int)((float)(plVar7->link->ascr << 10) * (float)ascale) +
                              plVar7->link->beta + iVar2);
          ppVar5->beta = iVar3;
        }
      }
      ppVar5 = ps_lattice_reverse_next(dag,(ps_latnode_t *)0x0);
    } while (ppVar5 != (ps_latlink_t *)0x0);
  }
  ppVar1 = dag->search;
  if ((ppVar1 == (ps_search_t *)0x0) || (iVar2 = strcmp(ppVar1->type,"ngram"), iVar2 != 0)) {
    model = (ngram_model_t *)0x0;
  }
  else {
    model = (ngram_model_t *)ppVar1[1].vt;
  }
  uVar6 = (uint)((float)(dag->final_node_ascr << 10) * (float)ascale);
  do {
    if (ppVar8 == (ps_latlink_t *)0x0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
              ,0x5a3,"Joint P(O,S) = %d P(S|O) = %d\n",(ulong)uVar6,(ulong)(uVar6 - dag->norm));
      return uVar6 - dag->norm;
    }
    if (model != (ngram_model_t *)0x0) {
      local_4c = ppVar8->from->basewid;
      local_48 = (ps_latlink_t *)CONCAT44(local_48._4_4_,ppVar8->to->basewid);
      iVar2 = dict_filler_word(dag->dict,local_4c);
      if (iVar2 == 0) {
        bVar11 = false;
      }
      else {
        bVar11 = ppVar8->from != dag->start;
      }
      iVar2 = dict_filler_word(dag->dict,(s3wid_t)local_48);
      if (iVar2 == 0) {
        bVar12 = false;
      }
      else {
        bVar12 = ppVar8->to != dag->end;
      }
      if ((!bVar12) && (ppVar9 = ppVar8, bVar11)) {
        do {
          ppVar9 = ppVar9->best_prev;
          if (ppVar9 == (ps_latlink_s *)0x0) {
            bVar11 = true;
            goto LAB_00110a06;
          }
          local_4c = ppVar9->from->basewid;
          iVar2 = dict_filler_word(dag->dict,local_4c);
          if (iVar2 == 0) {
            bVar11 = false;
            goto LAB_00110a06;
          }
        } while (ppVar9->from != dag->start);
        bVar11 = false;
      }
LAB_00110a06:
      if (!bVar11 && !bVar12) {
        iVar4 = ngram_ng_prob(model,(s3wid_t)local_48,&local_4c,1,&local_3c);
        uVar6 = uVar6 + iVar4;
      }
    }
    uVar6 = uVar6 + (int)((float)(ppVar8->ascr << 10) * (float)ascale);
    ppVar8 = ppVar8->best_prev;
  } while( true );
}

Assistant:

int32
ps_lattice_posterior(ps_lattice_t *dag, ngram_model_t *lmset,
                     float32 ascale)
{
    logmath_t *lmath;
    ps_latnode_t *node;
    ps_latlink_t *link;
    latlink_list_t *x;
    ps_latlink_t *bestend;
    int32 bestescr;

    lmath = dag->lmath;

    /* Reset all betas to zero. */
    for (node = dag->nodes; node; node = node->next) {
        for (x = node->exits; x; x = x->next) {
            x->link->beta = logmath_get_zero(lmath);
        }
    }

    bestend = NULL;
    bestescr = MAX_NEG_INT32;
    /* Accumulate backward probabilities for all links. */
    for (link = ps_lattice_reverse_edges(dag, NULL, NULL);
         link; link = ps_lattice_reverse_next(dag, NULL)) {
        int32 bprob, n_used;
        int32 from_wid, to_wid;
        int16 from_is_fil, to_is_fil;

        from_wid = link->from->basewid;
        to_wid = link->to->basewid;
        from_is_fil = dict_filler_word(dag->dict, from_wid) && link->from != dag->start;
        to_is_fil = dict_filler_word(dag->dict, to_wid) && link->to != dag->end;

        /* Find word predecessor if from-word is filler */
        if (!to_is_fil && from_is_fil) {
            ps_latlink_t *prev_link = link;
            while (prev_link->best_prev != NULL) {
                prev_link = prev_link->best_prev;
                from_wid = prev_link->from->basewid;
                if (!dict_filler_word(dag->dict, from_wid) || prev_link->from == dag->start) {
                    from_is_fil = FALSE;
                    break;
                }
            }
        }

        /* Calculate LM probability. */
        if (lmset && !from_is_fil && !to_is_fil)
            bprob = ngram_ng_prob(lmset, to_wid, &from_wid, 1, &n_used);
        else
            bprob = 0;

        if (link->to == dag->end) {
            /* Track the best path - we will backtrace in order to
               calculate the unscaled joint probability for sentence
               posterior. */
            if (link->path_scr BETTER_THAN bestescr) {
                bestescr = link->path_scr;
                bestend = link;
            }
            /* Imaginary exit link from final node has beta = 1.0 */
            link->beta = bprob + (int32)((dag->final_node_ascr << SENSCR_SHIFT) * ascale);
        }
        else {
            /* Update beta from all outgoing betas. */
            for (x = link->to->exits; x; x = x->next) {
                link->beta = logmath_add(lmath, link->beta,
                                         x->link->beta + bprob
                                         + (int)((x->link->ascr << SENSCR_SHIFT) * ascale));
            }
        }
    }

    /* Return P(S|O) = P(O,S)/P(O) */
    return ps_lattice_joint(dag, bestend, ascale) - dag->norm;
}